

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O2

int h264_sub_mb_pred(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,h264_macroblock *mb)

{
  uint32_t *val;
  int iVar1;
  int iVar2;
  int32_t iVar3;
  uint32_t (*pauVar4) [4];
  long lVar5;
  uint uVar6;
  int32_t *piVar7;
  long lVar8;
  uint32_t local_a0;
  int pmode [4];
  int ifrom [16];
  
  for (lVar8 = 0; iVar2 = (int)lVar8, lVar8 != 0x10; lVar8 = lVar8 + 4) {
    val = (uint32_t *)((long)mb->sub_mb_type + lVar8);
    iVar1 = h264_sub_mb_type(str,cabac,slice->slice_type,val);
    if (iVar1 != 0) {
      return 1;
    }
    uVar6 = *val;
    iVar1 = sub_mb_part_info[uVar6][0];
    *(int *)((long)pmode + lVar8) = sub_mb_part_info[uVar6][1];
    ifrom[lVar8] = -1;
    switch(iVar1) {
    case 0:
      ifrom[lVar8 + 1] = iVar2;
      ifrom[lVar8 + 2] = iVar2;
      ifrom[lVar8 + 3] = iVar2;
      break;
    case 1:
      ifrom[lVar8 + 1] = iVar2;
      ifrom[lVar8 + 2] = -1;
      iVar2 = iVar2 + 2;
      goto LAB_001032d2;
    case 2:
      ifrom[lVar8 + 1] = -1;
      ifrom[lVar8 + 2] = iVar2;
      iVar2 = iVar2 + 1;
LAB_001032d2:
      ifrom[lVar8 + 3] = iVar2;
      break;
    case 3:
      (ifrom + lVar8 + 1)[0] = -1;
      (ifrom + lVar8 + 1)[1] = -1;
      ifrom[lVar8 + 3] = -1;
    }
  }
  local_a0 = slice->num_ref_idx_l0_active_minus1;
  if ((slice->mbaff_frame_flag != 0) && (mb->mb_field_decoding_flag != 0)) {
    local_a0 = local_a0 * 2 + 1;
  }
  pauVar4 = mb->ref_idx;
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    if (((*(byte *)(pmode + lVar8) & 1) == 0) || (mb->mb_type == 0x1f)) {
      iVar2 = vs_infer(str,*pauVar4,0);
    }
    else {
      iVar2 = h264_ref_idx(str,cabac,(int)lVar8,0,local_a0,*pauVar4);
    }
    if (iVar2 != 0) {
      return 1;
    }
    pauVar4 = (uint32_t (*) [4])(*pauVar4 + 1);
  }
  local_a0 = slice->num_ref_idx_l1_active_minus1;
  if ((slice->mbaff_frame_flag != 0) && (mb->mb_field_decoding_flag != 0)) {
    local_a0 = local_a0 * 2 + 1;
  }
  pauVar4 = mb->ref_idx + 1;
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    if ((*(byte *)(pmode + lVar8) & 2) == 0) {
      iVar2 = vs_infer(str,*pauVar4,0);
    }
    else {
      iVar2 = h264_ref_idx(str,cabac,(int)lVar8,1,local_a0,*pauVar4);
    }
    if (iVar2 != 0) {
      return 1;
    }
    pauVar4 = (uint32_t (*) [4])(*pauVar4 + 1);
  }
  piVar7 = mb->mvd[0][0] + 1;
  for (lVar8 = 0; uVar6 = (uint)lVar8, lVar8 != 0x10; lVar8 = lVar8 + 1) {
    lVar5 = (long)ifrom[lVar8];
    if (lVar5 == -1) {
      if ((*(byte *)((long)pmode + (ulong)(uVar6 & 0xfffffffc)) & 1) == 0) {
        iVar2 = vs_infers(str,piVar7 + -1,0);
        if (iVar2 != 0) {
          return 1;
        }
        iVar3 = 0;
        goto LAB_001034a4;
      }
      iVar2 = h264_mvd(str,cabac,uVar6,0,0,(int32_t *)(piVar7 + -1));
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = h264_mvd(str,cabac,uVar6,1,0,piVar7);
    }
    else {
      iVar2 = vs_infers(str,(int32_t *)(piVar7 + -1),mb->mvd[0][lVar5][0]);
      if (iVar2 != 0) {
        return 1;
      }
      iVar3 = mb->mvd[0][lVar5][1];
LAB_001034a4:
      iVar2 = vs_infers(str,piVar7,iVar3);
    }
    if (iVar2 != 0) {
      return 1;
    }
    piVar7 = piVar7 + 2;
  }
  piVar7 = mb->mvd[1][0] + 1;
  lVar8 = 0;
  do {
    if (lVar8 == 0x10) {
      iVar2 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
      return (uint)(iVar2 != 0);
    }
    lVar5 = (long)ifrom[lVar8];
    if (lVar5 == -1) {
      uVar6 = (uint)lVar8;
      if ((*(byte *)((long)pmode + (ulong)(uVar6 & 0xfffffffc)) & 2) == 0) {
        iVar2 = vs_infers(str,piVar7 + -1,0);
        if (iVar2 != 0) {
          return 1;
        }
        iVar3 = 0;
        goto LAB_0010357c;
      }
      iVar2 = h264_mvd(str,cabac,uVar6,0,1,(int32_t *)(piVar7 + -1));
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = h264_mvd(str,cabac,uVar6,1,1,piVar7);
    }
    else {
      iVar2 = vs_infers(str,(int32_t *)(piVar7 + -1),mb->mvd[1][lVar5][0]);
      if (iVar2 != 0) {
        return 1;
      }
      iVar3 = (*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))[lVar5][1];
LAB_0010357c:
      iVar2 = vs_infers(str,piVar7,iVar3);
    }
    if (iVar2 != 0) {
      return 1;
    }
    lVar8 = lVar8 + 1;
    piVar7 = piVar7 + 2;
  } while( true );
}

Assistant:

int h264_sub_mb_pred(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb) {
	int i;
	int pmode[4];
	int ifrom[16];
	for (i = 0; i < 4; i++) {
		if (h264_sub_mb_type(str, cabac, slice->slice_type, &mb->sub_mb_type[i])) return 1;
		pmode[i] = sub_mb_part_info[mb->sub_mb_type[i]][1];
		int sm = sub_mb_part_info[mb->sub_mb_type[i]][0];
		ifrom[i*4] = -1;
		switch (sm) {
			case 0:
				ifrom[i*4 + 1] = i*4;
				ifrom[i*4 + 2] = i*4;
				ifrom[i*4 + 3] = i*4;
				break;
			case 1:
				ifrom[i*4 + 1] = i*4;
				ifrom[i*4 + 2] = -1;
				ifrom[i*4 + 3] = i*4 + 2;
				break;
			case 2:
				ifrom[i*4 + 1] = -1;
				ifrom[i*4 + 2] = i*4;
				ifrom[i*4 + 3] = i*4 + 1;
				break;
			case 3:
				ifrom[i*4 + 1] = -1;
				ifrom[i*4 + 2] = -1;
				ifrom[i*4 + 3] = -1;
				break;
		}
	}
	int max = slice->num_ref_idx_l0_active_minus1;
	if (slice->mbaff_frame_flag && mb->mb_field_decoding_flag)
		max *= 2, max++;
	for (i = 0; i < 4; i++) {
		if (pmode[i] & 1 && mb->mb_type != H264_MB_TYPE_P_8X8REF0) {
			if (h264_ref_idx(str, cabac, i, 0, max, &mb->ref_idx[0][i])) return 1;
		} else {
			if (vs_infer(str, &mb->ref_idx[0][i], 0)) return 1;
		}
	}
	max = slice->num_ref_idx_l1_active_minus1;
	if (slice->mbaff_frame_flag && mb->mb_field_decoding_flag)
		max *= 2, max++;
	for (i = 0; i < 4; i++) {
		if (pmode[i] & 2) {
			if (h264_ref_idx(str, cabac, i, 1, max, &mb->ref_idx[1][i])) return 1;
		} else {
			if (vs_infer(str, &mb->ref_idx[1][i], 0)) return 1;
		}
	}
	for (i = 0; i < 16; i++) {
		if (ifrom[i] == -1) {
			if (pmode[i/4] & 1) {
				if (h264_mvd(str, cabac, i, 0, 0, &mb->mvd[0][i][0])) return 1;
				if (h264_mvd(str, cabac, i, 1, 0, &mb->mvd[0][i][1])) return 1;
			} else {
				if (vs_infers(str, &mb->mvd[0][i][0], 0)) return 1;
				if (vs_infers(str, &mb->mvd[0][i][1], 0)) return 1;
			}
		} else {
			if (vs_infers(str, &mb->mvd[0][i][0], mb->mvd[0][ifrom[i]][0])) return 1;
			if (vs_infers(str, &mb->mvd[0][i][1], mb->mvd[0][ifrom[i]][1])) return 1;
		}
	}
	for (i = 0; i < 16; i++) {
		if (ifrom[i] == -1) {
			if (pmode[i/4] & 2) {
				if (h264_mvd(str, cabac, i, 0, 1, &mb->mvd[1][i][0])) return 1;
				if (h264_mvd(str, cabac, i, 1, 1, &mb->mvd[1][i][1])) return 1;
			} else {
				if (vs_infers(str, &mb->mvd[1][i][0], 0)) return 1;
				if (vs_infers(str, &mb->mvd[1][i][1], 0)) return 1;
			}
		} else {
			if (vs_infers(str, &mb->mvd[1][i][0], mb->mvd[1][ifrom[i]][0])) return 1;
			if (vs_infers(str, &mb->mvd[1][i][1], mb->mvd[1][ifrom[i]][1])) return 1;
		}
	}
	if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
	return 0;
}